

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECore.cpp
# Opt level: O0

offset_t __thiscall PECore::secHdrsOffset(PECore *this)

{
  offset_t oVar1;
  offset_t size;
  offset_t offset;
  PECore *this_local;
  
  oVar1 = peOptHdrOffset(this);
  if (oVar1 == 0xffffffffffffffff) {
    this_local = (PECore *)0xffffffffffffffff;
  }
  else if (this->fHdr == (IMAGE_FILE_HEADER *)0x0) {
    this_local = (PECore *)0xffffffffffffffff;
  }
  else {
    this_local = (PECore *)(oVar1 + this->fHdr->SizeOfOptionalHeader);
  }
  return (offset_t)this_local;
}

Assistant:

offset_t PECore::secHdrsOffset() const
{
    const offset_t offset = peOptHdrOffset();
    if (offset == INVALID_ADDR) {
        return INVALID_ADDR;
    }
    if (!fHdr) {
        return INVALID_ADDR;
    }
    const offset_t size = static_cast<offset_t>(this->fHdr->SizeOfOptionalHeader);
    return offset + size;
}